

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

vmd_bst_node_t * vmd_bst_revert(vmd_bst_t *tree)

{
  vmd_bst_node_t *local_28;
  vmd_bst_node_t *first;
  vmd_bst_node_t *prev;
  vmd_bst_node_t *i;
  vmd_bst_t *tree_local;
  
  first = (vmd_bst_node_t *)0x0;
  local_28 = (vmd_bst_node_t *)0x0;
  prev = tree->save;
  while( true ) {
    if (prev == (vmd_bst_node_t *)0x0) {
      prev = tree->inserted;
      while( true ) {
        if (prev == (vmd_bst_node_t *)0x0) {
          prev = tree->erased;
          while( true ) {
            if (prev == (vmd_bst_node_t *)0x0) {
              if (local_28 == (vmd_bst_node_t *)0x0) {
                local_28 = tree->erased;
              }
              else {
                first->next = tree->erased;
              }
              tree->inserted = (vmd_bst_node_t *)0x0;
              tree->erased = (vmd_bst_node_t *)0x0;
              return local_28;
            }
            if (((byte)prev->field_0x20 >> 5 & 1) != 0) break;
            insert_node(tree,prev);
            prev = prev->next;
          }
          __assert_fail("!i->inserted",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c"
                        ,0x2a7,"vmd_bst_node_t *vmd_bst_revert(vmd_bst_t *)");
        }
        if (((byte)prev->field_0x20 >> 4 & 1) != 0) {
          erase_node(tree,prev);
          dlist_insert(&tree->free,prev);
          if (first == (vmd_bst_node_t *)0x0) {
            local_28 = prev;
          }
          else {
            first->next = prev;
          }
          first = prev;
        }
        if (((byte)prev->field_0x20 >> 5 & 1) == 0) break;
        prev->field_0x20 = prev->field_0x20 & 0xdf;
        prev = prev->next;
      }
      __assert_fail("i->inserted",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c"
                    ,0x2a3,"vmd_bst_node_t *vmd_bst_revert(vmd_bst_t *)");
    }
    if (((byte)prev->field_0x20 >> 4 & 1) != 0) break;
    memcpy(&prev->parent->field_0x21,&prev->field_0x21,tree->csize);
    prev->parent->field_0x20 = prev->parent->field_0x20 & 0xbf;
    dlist_erase(&tree->save,prev);
    dlist_insert(&tree->free,prev);
    prev = tree->save;
  }
  __assert_fail("!i->in_tree",
                "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c",
                0x293,"vmd_bst_node_t *vmd_bst_revert(vmd_bst_t *)");
}

Assistant:

bst_node_t *
bst_revert(bst_t *tree)
{
	bst_node_t *i, *prev = NULL, *first = NULL;

	for (i = tree->save; i != NULL; i = tree->save) {
		assert(!i->in_tree);
		memcpy(i->parent->data, i->data, tree->csize);
		i->parent->saved = 0;
		dlist_erase(&tree->save, i);
		dlist_insert(&tree->free, i);
	}
	for (i = tree->inserted; i != NULL; i = i->next) {
		if (i->in_tree) {
			erase_node(tree, i);
			dlist_insert(&tree->free, i);
			if (prev == NULL)
				first = i;
			else
				prev->next = i;
			prev = i;
		}
		assert(i->inserted);
		i->inserted = 0;
	}
	for (i = tree->erased; i != NULL; i = i->next) {
		assert(!i->inserted);
		insert_node(tree, i);
	}

	if (first == NULL)
		first = tree->erased;
	else
		prev->next = tree->erased;

	tree->erased = tree->inserted = NULL;
	return first;
}